

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

feat_t * feat_init(char *type,cmn_type_t cmn,int32 varnorm,agc_type_t agc,int32 breport,
                  int32 cepsize)

{
  float32 m;
  int iVar1;
  uint32 *puVar2;
  char *ptr;
  size_t sVar3;
  cmn_t *pcVar4;
  agc_t *paVar5;
  mfcc_t **ppmVar6;
  char *pcVar7;
  int local_84;
  char *wd;
  char *mtype;
  char *strp;
  size_t len;
  int local_40;
  int32 l;
  int32 k;
  int32 i;
  feat_t *fcb;
  int32 local_28;
  int32 cepsize_local;
  int32 breport_local;
  agc_type_t agc_local;
  int32 varnorm_local;
  cmn_type_t cmn_local;
  char *type_local;
  
  fcb._4_4_ = cepsize;
  if (cepsize == 0) {
    fcb._4_4_ = 0xd;
  }
  local_28 = breport;
  cepsize_local = agc;
  breport_local = varnorm;
  agc_local = cmn;
  _varnorm_local = type;
  if (breport != 0) {
    pcVar7 = "no";
    if (varnorm != 0) {
      pcVar7 = "yes";
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x2cb,
            "Initializing feature stream to type: \'%s\', ceplen=%d, CMN=\'%s\', VARNORM=\'%s\', AGC=\'%s\'\n"
            ,type,(ulong)fcb._4_4_,cmn_type_str[cmn],pcVar7,agc_type_str[agc]);
  }
  _k = (feat_t *)
       __ckd_calloc__(1,0x90,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                      ,0x2cd);
  _k->refcount = 1;
  pcVar7 = __ckd_salloc__(_varnorm_local,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                          ,0x2cf);
  _k->name = pcVar7;
  iVar1 = strcmp(_varnorm_local,"s2_4x");
  if (iVar1 == 0) {
    if (fcb._4_4_ != 0xd) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0x2d3,"s2_4x features require cepsize == 13\n");
      ckd_free(_k);
      return (feat_t *)0x0;
    }
    _k->cepsize = 0xd;
    _k->n_stream = 4;
    puVar2 = (uint32 *)
             __ckd_calloc__(4,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                            ,0x2d9);
    _k->stream_len = puVar2;
    *_k->stream_len = 0xc;
    _k->stream_len[1] = 0x18;
    _k->stream_len[2] = 3;
    _k->stream_len[3] = 0xc;
    _k->out_dim = 0x33;
    _k->window_size = 4;
    _k->compute_feat = feat_s2_4x_cep2feat;
  }
  else {
    iVar1 = strcmp(_varnorm_local,"s3_1x39");
    if ((iVar1 == 0) || (iVar1 = strcmp(_varnorm_local,"1s_12c_12d_3p_12dd"), iVar1 == 0)) {
      if (fcb._4_4_ != 0xd) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x2e5,"s2_4x features require cepsize == 13\n");
        ckd_free(_k);
        return (feat_t *)0x0;
      }
      _k->cepsize = 0xd;
      _k->n_stream = 1;
      puVar2 = (uint32 *)
               __ckd_calloc__(1,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x2eb);
      _k->stream_len = puVar2;
      *_k->stream_len = 0x27;
      _k->out_dim = 0x27;
      _k->window_size = 3;
      _k->compute_feat = feat_s3_1x39_cep2feat;
    }
    else {
      iVar1 = strncmp(_varnorm_local,"1s_c_d_dd",9);
      if (iVar1 == 0) {
        _k->cepsize = fcb._4_4_;
        _k->n_stream = 1;
        puVar2 = (uint32 *)
                 __ckd_calloc__(1,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                ,0x2f4);
        _k->stream_len = puVar2;
        *_k->stream_len = fcb._4_4_ * 3;
        _k->out_dim = fcb._4_4_ * 3;
        _k->window_size = 3;
        _k->compute_feat = feat_1s_c_d_dd_cep2feat;
      }
      else {
        iVar1 = strncmp(_varnorm_local,"1s_c_d_ld_dd",0xc);
        if (iVar1 == 0) {
          _k->cepsize = fcb._4_4_;
          _k->n_stream = 1;
          puVar2 = (uint32 *)
                   __ckd_calloc__(1,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                  ,0x2fd);
          _k->stream_len = puVar2;
          *_k->stream_len = fcb._4_4_ << 2;
          _k->out_dim = fcb._4_4_ << 2;
          _k->window_size = 4;
          _k->compute_feat = feat_1s_c_d_ld_dd_cep2feat;
        }
        else {
          iVar1 = strncmp(_varnorm_local,"cep_dcep",8);
          if ((iVar1 == 0) || (iVar1 = strncmp(_varnorm_local,"1s_c_d",6), iVar1 == 0)) {
            _k->cepsize = fcb._4_4_;
            _k->n_stream = 1;
            puVar2 = (uint32 *)
                     __ckd_calloc__(1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                    ,0x307);
            _k->stream_len = puVar2;
            *_k->stream_len = _k->cepsize << 1;
            _k->out_dim = *_k->stream_len;
            _k->window_size = 2;
            _k->compute_feat = feat_s3_cep_dcep;
          }
          else {
            iVar1 = strncmp(_varnorm_local,"cep",3);
            if ((iVar1 == 0) || (iVar1 = strncmp(_varnorm_local,"1s_c",4), iVar1 == 0)) {
              _k->cepsize = fcb._4_4_;
              _k->n_stream = 1;
              puVar2 = (uint32 *)
                       __ckd_calloc__(1,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                      ,0x311);
              _k->stream_len = puVar2;
              *_k->stream_len = _k->cepsize;
              _k->out_dim = *_k->stream_len;
              _k->window_size = 0;
              _k->compute_feat = feat_s3_cep;
            }
            else {
              iVar1 = strncmp(_varnorm_local,"1s_3c",5);
              if ((iVar1 == 0) || (iVar1 = strncmp(_varnorm_local,"1s_4c",5), iVar1 == 0)) {
                iVar1 = strncmp(_varnorm_local,"1s_3c",5);
                if (iVar1 == 0) {
                  _k->window_size = 3;
                }
                else {
                  _k->window_size = 4;
                }
                _k->cepsize = fcb._4_4_;
                _k->n_stream = 1;
                puVar2 = (uint32 *)
                         __ckd_calloc__(1,4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                        ,800);
                _k->stream_len = puVar2;
                *_k->stream_len = _k->cepsize * (_k->window_size * 2 + 1);
                _k->out_dim = *_k->stream_len;
                _k->compute_feat = feat_copy;
              }
              else {
                pcVar7 = __ckd_salloc__(_varnorm_local,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                        ,0x329);
                ptr = __ckd_salloc__(_varnorm_local,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                     ,0x32a);
                sVar3 = strlen(pcVar7);
                local_40 = 0;
                for (l = 1; (ulong)(long)l < sVar3 - 1; l = l + 1) {
                  if (pcVar7[l] == ',') {
                    pcVar7[l] = ' ';
                    local_40 = local_40 + 1;
                  }
                  else if (pcVar7[l] == ':') {
                    pcVar7[l] = '\0';
                    iVar1 = atoi(pcVar7 + (long)l + 1);
                    _k->window_size = iVar1;
                    break;
                  }
                }
                local_40 = local_40 + 1;
                _k->n_stream = local_40;
                puVar2 = (uint32 *)
                         __ckd_calloc__((long)local_40,4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                        ,0x341);
                _k->stream_len = puVar2;
                l = 0;
                _k->out_dim = 0;
                _k->cepsize = 0;
                mtype = pcVar7;
                while (iVar1 = __isoc99_sscanf(mtype,"%s%n",ptr,(long)&len + 4), iVar1 == 1) {
                  mtype = mtype + len._4_4_;
                  if (((_k->n_stream <= l) ||
                      (iVar1 = __isoc99_sscanf(ptr,"%u",_k->stream_len + l), iVar1 != 1)) ||
                     (_k->stream_len[l] == 0)) {
                    err_msg(ERR_FATAL,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                            ,0x34d,"Bad feature type argument\n");
                    exit(1);
                  }
                  _k->cepsize = _k->stream_len[l] + _k->cepsize;
                  if (0 < _k->window_size) {
                    _k->stream_len[l] = (_k->window_size * 2 + 1) * _k->stream_len[l];
                  }
                  _k->out_dim = _k->stream_len[l] + _k->out_dim;
                  l = l + 1;
                }
                if (l != _k->n_stream) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                          ,0x357,"Bad feature type argument\n");
                  exit(1);
                }
                if (_k->cepsize != fcb._4_4_) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                          ,0x359,"Bad feature type argument\n");
                  exit(1);
                }
                _k->compute_feat = feat_copy;
                ckd_free(pcVar7);
                ckd_free(ptr);
              }
            }
          }
        }
      }
    }
  }
  if (agc_local != AGC_NONE) {
    pcVar4 = cmn_init(_k->cepsize);
    _k->cmn_struct = pcVar4;
  }
  _k->cmn = agc_local;
  _k->varnorm = breport_local;
  if (cepsize_local != 0) {
    paVar5 = agc_init();
    _k->agc_struct = paVar5;
    m = 5.0;
    if (agc_local == AGC_NONE) {
      m = 10.0;
    }
    agc_emax_set(_k->agc_struct,m);
  }
  _k->agc = cepsize_local;
  if (SBORROW4(0x100,_k->window_size * 2) == _k->window_size * -2 + 0x100 < 0) {
    local_84 = 0x100;
  }
  else {
    local_84 = _k->window_size << 1;
  }
  ppmVar6 = (mfcc_t **)
            __ckd_calloc_2d__((long)local_84,(long)_k->cepsize,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x375);
  _k->cepbuf = ppmVar6;
  ppmVar6 = (mfcc_t **)
            __ckd_calloc__((long)(_k->window_size * 2 + 1),8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                           ,0x379);
  _k->tmpcepbuf = ppmVar6;
  return _k;
}

Assistant:

feat_t *
feat_init(char const *type, cmn_type_t cmn, int32 varnorm,
          agc_type_t agc, int32 breport, int32 cepsize)
{
    feat_t *fcb;

    if (cepsize == 0)
        cepsize = 13;
    if (breport)
        E_INFO
            ("Initializing feature stream to type: '%s', ceplen=%d, CMN='%s', VARNORM='%s', AGC='%s'\n",
             type, cepsize, cmn_type_str[cmn], varnorm ? "yes" : "no", agc_type_str[agc]);

    fcb = (feat_t *) ckd_calloc(1, sizeof(feat_t));
    fcb->refcount = 1;
    fcb->name = (char *) ckd_salloc(type);
    if (strcmp(type, "s2_4x") == 0) {
        /* Sphinx-II format 4-stream feature (Hack!! hardwired constants below) */
        if (cepsize != 13) {
            E_ERROR("s2_4x features require cepsize == 13\n");
            ckd_free(fcb);
            return NULL;
        }
        fcb->cepsize = 13;
        fcb->n_stream = 4;
        fcb->stream_len = (uint32 *) ckd_calloc(4, sizeof(uint32));
        fcb->stream_len[0] = 12;
        fcb->stream_len[1] = 24;
        fcb->stream_len[2] = 3;
        fcb->stream_len[3] = 12;
        fcb->out_dim = 51;
        fcb->window_size = 4;
        fcb->compute_feat = feat_s2_4x_cep2feat;
    }
    else if ((strcmp(type, "s3_1x39") == 0) || (strcmp(type, "1s_12c_12d_3p_12dd") == 0)) {
        /* 1-stream cep/dcep/pow/ddcep (Hack!! hardwired constants below) */
        if (cepsize != 13) {
            E_ERROR("s2_4x features require cepsize == 13\n");
            ckd_free(fcb);
            return NULL;
        }
        fcb->cepsize = 13;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = 39;
        fcb->out_dim = 39;
        fcb->window_size = 3;
        fcb->compute_feat = feat_s3_1x39_cep2feat;
    }
    else if (strncmp(type, "1s_c_d_dd", 9) == 0) {
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = cepsize * 3;
        fcb->out_dim = cepsize * 3;
        fcb->window_size = FEAT_DCEP_WIN + 1; /* ddcep needs the extra 1 */
        fcb->compute_feat = feat_1s_c_d_dd_cep2feat;
    }
    else if (strncmp(type, "1s_c_d_ld_dd", 12) == 0) {
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = cepsize * 4;
        fcb->out_dim = cepsize * 4;
        fcb->window_size = FEAT_DCEP_WIN * 2;
        fcb->compute_feat = feat_1s_c_d_ld_dd_cep2feat;
    }
    else if (strncmp(type, "cep_dcep", 8) == 0 || strncmp(type, "1s_c_d", 6) == 0) {
        /* 1-stream cep/dcep */
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = feat_cepsize(fcb) * 2;
        fcb->out_dim = fcb->stream_len[0];
        fcb->window_size = 2;
        fcb->compute_feat = feat_s3_cep_dcep;
    }
    else if (strncmp(type, "cep", 3) == 0 || strncmp(type, "1s_c", 4) == 0) {
        /* 1-stream cep */
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = feat_cepsize(fcb);
        fcb->out_dim = fcb->stream_len[0];
        fcb->window_size = 0;
        fcb->compute_feat = feat_s3_cep;
    }
    else if (strncmp(type, "1s_3c", 5) == 0 || strncmp(type, "1s_4c", 5) == 0) {
	/* 1-stream cep with frames concatenated, so called cepwin features */
        if (strncmp(type, "1s_3c", 5) == 0)
            fcb->window_size = 3;
        else
    	    fcb->window_size = 4;

        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = feat_cepsize(fcb) * (2 * fcb->window_size + 1);
        fcb->out_dim = fcb->stream_len[0];
        fcb->compute_feat = feat_copy;
    }
    else {
        int32 i, k, l;
        size_t len;
        char *strp;
        char *mtype = ckd_salloc(type);
        char *wd = ckd_salloc(type);
        /*
         * Generic definition: Format should be %d,%d,%d,...,%d (i.e.,
         * comma separated list of feature stream widths; #items =
         * #streams).  An optional window size (frames will be
         * concatenated) is also allowed, which can be specified with
         * a colon after the list of feature streams.
         */
        len = strlen(mtype);
        k = 0;
        for (i = 1; i < len - 1; i++) {
            if (mtype[i] == ',') {
                mtype[i] = ' ';
                k++;
            }
            else if (mtype[i] == ':') {
                mtype[i] = '\0';
                fcb->window_size = atoi(mtype + i + 1);
                break;
            }
        }
        k++;                    /* Presumably there are (#commas+1) streams */
        fcb->n_stream = k;
        fcb->stream_len = (uint32 *) ckd_calloc(k, sizeof(uint32));

        /* Scan individual feature stream lengths */
        strp = mtype;
        i = 0;
        fcb->out_dim = 0;
        fcb->cepsize = 0;
        while (sscanf(strp, "%s%n", wd, &l) == 1) {
            strp += l;
            if ((i >= fcb->n_stream)
                || (sscanf(wd, "%u", &(fcb->stream_len[i])) != 1)
                || (fcb->stream_len[i] <= 0))
                E_FATAL("Bad feature type argument\n");
            /* Input size before windowing */
            fcb->cepsize += fcb->stream_len[i];
            if (fcb->window_size > 0)
                fcb->stream_len[i] *= (fcb->window_size * 2 + 1);
            /* Output size after windowing */
            fcb->out_dim += fcb->stream_len[i];
            i++;
        }
        if (i != fcb->n_stream)
            E_FATAL("Bad feature type argument\n");
        if (fcb->cepsize != cepsize)
    	    E_FATAL("Bad feature type argument\n");

        /* Input is already the feature stream */
        fcb->compute_feat = feat_copy;
        ckd_free(mtype);
        ckd_free(wd);
    }

    if (cmn != CMN_NONE)
        fcb->cmn_struct = cmn_init(feat_cepsize(fcb));
    fcb->cmn = cmn;
    fcb->varnorm = varnorm;
    if (agc != AGC_NONE) {
        fcb->agc_struct = agc_init();
        /*
         * No need to check if agc is set to EMAX; agc_emax_set() changes only emax related things
         * Moreover, if agc is not NONE and block mode is used, feat_agc() SILENTLY
         * switches to EMAX
         */
        /* HACK: hardwired initial estimates based on use of CMN (from Sphinx2) */
        agc_emax_set(fcb->agc_struct, (cmn != CMN_NONE) ? 5.0 : 10.0);
    }
    fcb->agc = agc;
    /*
     * Make sure this buffer is large enough to be used in feat_s2mfc2feat_block_utt()
     */
    fcb->cepbuf = (mfcc_t **) ckd_calloc_2d((LIVEBUFBLOCKSIZE < feat_window_size(fcb) * 2) ? feat_window_size(fcb) * 2 : LIVEBUFBLOCKSIZE,
                                            feat_cepsize(fcb),
                                            sizeof(mfcc_t));
    /* This one is actually just an array of pointers to "flatten out"
     * wraparounds. */
    fcb->tmpcepbuf = (mfcc_t** )ckd_calloc(2 * feat_window_size(fcb) + 1,
                                sizeof(*fcb->tmpcepbuf));

    return fcb;
}